

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_factory.h
# Opt level: O2

void __thiscall
linux_util::canvas_factory<(linux_util::screen_t)0>::initialize
          (canvas_factory<(linux_util::screen_t)0> *this)

{
  fb_var_screeninfo *argp;
  __u32 _Var1;
  __u32 _Var2;
  __u32 _Var3;
  uint uVar4;
  fildes_t __fd;
  uint8_t *puVar5;
  
  argp = &this->vinfo;
  device::xioctl(&this->super_device,0x4600,argp);
  memcpy(&this->vinfo_old,argp,0xa0);
  _Var1 = *(__u32 *)&(this->super_device).field_0x4c;
  _Var2 = (__u32)this->width;
  (this->vinfo).xres = _Var2;
  _Var3 = (__u32)this->height;
  (this->vinfo).yres = _Var3;
  this->screen1_yoffset = _Var3;
  this->screen2_yoffset = _Var3 * 2;
  (this->vinfo).xres_virtual = _Var2;
  (this->vinfo).yres_virtual = _Var3 * 3;
  (this->vinfo).yoffset = _Var3 * 2;
  (this->vinfo).grayscale = 0;
  (this->vinfo).bits_per_pixel = _Var1;
  (this->vinfo).activate = 0x10;
  device::xioctl(&this->super_device,0x4601,argp);
  device::xioctl(&this->super_device,0x4600,argp);
  device::xioctl(&this->super_device,0x4602,&this->finfo);
  uVar4 = (this->finfo).smem_len;
  this->screensize = (this->finfo).line_length * (this->vinfo).yres;
  __fd = device::fildes(&this->super_device);
  puVar5 = (uint8_t *)mmap((void *)0x0,(ulong)uVar4,3,1,__fd,0);
  this->screen0 = puVar5;
  this->screen1 = puVar5 + this->screensize;
  this->screen2 = puVar5 + this->screensize + this->screensize;
  return;
}

Assistant:

void initialize() override final {
            xioctl(FBIOGET_VSCREENINFO, &vinfo); // acquire variable info
            memcpy(&vinfo_old, &vinfo, sizeof(struct fb_var_screeninfo)); // copy current info for restore
            vinfo.xres = width;
            vinfo.yres = height;
            screen1_yoffset = vinfo.yres;
            screen2_yoffset = screen1_yoffset + vinfo.yres;
            vinfo.xres_virtual = vinfo.xres;
            vinfo.yres_virtual = vinfo.yres * 3; //make space for 2 virtual screens
            vinfo.yoffset = screen2_yoffset; //so the first swap works correctly
            vinfo.grayscale = 0; // ensure colour
            vinfo.bits_per_pixel = DEFAULT_BPP;
            vinfo.activate = FB_ACTIVATE_VBL;
            xioctl(FBIOPUT_VSCREENINFO, &vinfo); // write new vinfo
            xioctl(FBIOGET_VSCREENINFO, &vinfo); // re-acquire variable info
            xioctl(FBIOGET_FSCREENINFO, &finfo); // acquire fixed info
            screensize = vinfo.yres * finfo.line_length; // size of visible area
            //memory map entire frame buffer of 3 x "screens"
            screen0 = static_cast<uint8_t *>(mmap(0, finfo.smem_len, PROT_READ | PROT_WRITE, MAP_SHARED, device::fildes(), (off_t)0));
            screen1 = screen0 + screensize; // offset each of the virtual screens
            screen2 = screen1 + screensize;

        }